

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_opcode_ds(Context *ctx,char *opcode)

{
  size_t in_RCX;
  size_t in_RDX;
  char src0 [64];
  char dst [64];
  char acStack_a8 [64];
  char local_68 [72];
  
  make_ARB1_destarg_string(ctx,local_68,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,acStack_a8,in_RCX);
  output_line(ctx,"%s%s, %s;",opcode,local_68,acStack_a8);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_opcode_ds(Context *ctx, const char *opcode)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    output_line(ctx, "%s%s, %s;", opcode, dst, src0);
    emit_ARB1_dest_modifiers(ctx);
}